

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

bool __thiscall crnlib::dxt_image::flip_x(dxt_image *this)

{
  element_type eVar1;
  undefined4 uVar2;
  char cVar3;
  short sVar9;
  short sVar10;
  ushort uVar11;
  short sVar12;
  short sVar13;
  ushort uVar14;
  short sVar15;
  short sVar16;
  uint uVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  unkuint9 Var26;
  undefined1 auVar27 [11];
  undefined1 auVar28 [13];
  undefined1 auVar29 [14];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  uint6 uVar32;
  short sVar33;
  undefined6 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  uint uVar37;
  uint uVar38;
  uint value;
  uint value_00;
  ulong uVar39;
  uint y;
  uint uVar40;
  uint w;
  bool bVar41;
  byte bVar42;
  uint uVar43;
  byte bVar44;
  uint uVar45;
  short sVar46;
  uint uVar50;
  undefined1 auVar48 [16];
  undefined1 auVar51 [14];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ulong uVar57;
  element tmp;
  dxt5_block local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  dxt_image *local_48;
  ulong local_40;
  ulong local_38;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined1 auVar47 [14];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  
  if (((uint)(this->m_format + ~cDXN_YX) < 5) ||
     (uVar37 = this->m_width, 4 < uVar37 && (uVar37 & 3) != 0)) {
    bVar41 = false;
  }
  else {
    bVar41 = true;
    if (uVar37 != 1) {
      uVar37 = this->m_blocks_x;
      uVar45 = uVar37 >> 1;
      if (1 < uVar37) {
        uVar40 = 0;
        do {
          flip_col(this,uVar40);
          uVar40 = uVar40 + 1;
        } while (uVar45 != uVar40);
        uVar37 = this->m_blocks_x;
      }
      if ((uVar37 & 1) != 0) {
        uVar37 = this->m_width;
        uVar38 = this->m_blocks_y;
        w = 4;
        if (uVar37 < 4) {
          w = uVar37;
        }
        if (uVar38 != 0) {
          local_4c = w >> 1;
          local_54 = w & 0xfffffffe;
          local_58 = w * 2 - 2;
          local_40 = 0;
          uVar17 = this->m_num_elements_per_block;
          local_50 = uVar45;
          local_48 = this;
          do {
            uVar39 = (ulong)uVar17;
            uVar50 = 0;
            if (uVar17 != 0) {
              local_38 = 0;
              do {
                local_60 = *(dxt5_block *)
                            (this->m_pElements +
                            ((this->m_blocks_x * (int)local_40 + uVar45) * (int)uVar39 +
                            (int)local_38));
                eVar1 = this->m_element_type[local_38];
                if (eVar1 == cAlphaDXT5) {
                  dxt5_block::flip_x(&local_60,w,4);
                }
                else if (eVar1 == cAlphaDXT3) {
                  if (1 < uVar37) {
                    uVar45 = 0;
                    do {
                      uVar40 = 0;
                      do {
                        value = dxt3_block::get_alpha((dxt3_block *)&local_60,uVar45,uVar40,false);
                        value_00 = dxt3_block::get_alpha
                                             ((dxt3_block *)&local_60,~uVar45 + w,uVar40,false);
                        dxt3_block::set_alpha((dxt3_block *)&local_60,uVar45,uVar40,value_00,false);
                        dxt3_block::set_alpha
                                  ((dxt3_block *)&local_60,~uVar45 + w,uVar40,value,false);
                        uVar40 = uVar40 + 1;
                      } while (uVar40 != 4);
                      uVar45 = uVar45 + 1;
                    } while (uVar45 != local_4c);
                  }
                }
                else if ((eVar1 == cColorDXT1) && (1 < uVar37)) {
                  uVar38 = 0;
                  auVar48 = ZEXT416((uint)local_60.m_selectors._2_4_);
                  uVar45 = local_58;
                  do {
                    bVar42 = ~(byte)(3 << ((byte)uVar45 & 0x1f));
                    bVar44 = ~(byte)(3 << ((byte)uVar38 & 0x1f));
                    auVar55 = pshuflw(in_XMM2,ZEXT216(CONCAT11(bVar44,bVar44)),0);
                    auVar18[0xd] = 0;
                    auVar18._0_13_ = auVar48._0_13_;
                    auVar18[0xe] = auVar48[7];
                    auVar20[0xc] = auVar48[6];
                    auVar20._0_12_ = auVar48._0_12_;
                    auVar20._13_2_ = auVar18._13_2_;
                    auVar21[0xb] = 0;
                    auVar21._0_11_ = auVar48._0_11_;
                    auVar21._12_3_ = auVar20._12_3_;
                    auVar22[10] = auVar48[5];
                    auVar22._0_10_ = auVar48._0_10_;
                    auVar22._11_4_ = auVar21._11_4_;
                    auVar23[9] = 0;
                    auVar23._0_9_ = auVar48._0_9_;
                    auVar23._10_5_ = auVar22._10_5_;
                    auVar24[8] = auVar48[4];
                    auVar24._0_8_ = auVar48._0_8_;
                    auVar24._9_6_ = auVar23._9_6_;
                    auVar25._7_8_ = 0;
                    auVar25._0_7_ = auVar24._8_7_;
                    Var26 = CONCAT81(SUB158(auVar25 << 0x40,7),auVar48[3]);
                    auVar30._9_6_ = 0;
                    auVar30._0_9_ = Var26;
                    auVar27._1_10_ = SUB1510(auVar30 << 0x30,5);
                    auVar27[0] = auVar48[2];
                    auVar31._11_4_ = 0;
                    auVar31._0_11_ = auVar27;
                    auVar28._1_12_ = SUB1512(auVar31 << 0x20,3);
                    auVar28[0] = auVar48[1];
                    auVar19._10_2_ = 0;
                    auVar19._0_10_ = auVar28._0_10_ << 0x10;
                    auVar19._12_2_ = (short)Var26;
                    uVar32 = CONCAT42(auVar19._10_4_,auVar27._0_2_);
                    auVar29._6_8_ = 0;
                    auVar29._0_6_ = uVar32;
                    in_XMM2 = auVar55 & auVar48;
                    uVar39 = (ulong)uVar38;
                    uVar50 = (uint)CONCAT82(SUB148(auVar29 << 0x40,6),auVar28._0_2_);
                    uVar43 = (uint)uVar32;
                    uVar17 = auVar19._10_4_ >> 0x10;
                    auVar55 = ZEXT216(CONCAT11(bVar42,bVar42));
                    uVar57 = (ulong)uVar45;
                    auVar56 = pshuflw(auVar55,auVar55,0);
                    auVar52._8_4_ = uVar43 >> uVar57 & 3;
                    auVar52._12_4_ = uVar17 >> uVar57 & 3;
                    auVar52._0_8_ =
                         CONCAT44(uVar50 >> uVar57,((byte)(auVar48[0] >> uVar57) & 3) << uVar38) &
                         0x3ffffffff;
                    auVar55._8_4_ = uVar43 >> uVar39 & 3;
                    auVar55._12_4_ = uVar17 >> uVar39 & 3;
                    auVar52 = auVar52 & _DAT_001ae030;
                    sVar9 = auVar52._0_2_;
                    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar52[0] - (0xff < sVar9);
                    sVar10 = auVar52._2_2_;
                    sVar46 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar52[2] - (0xff < sVar10)
                                      ,cVar3);
                    uVar11 = auVar52._4_2_;
                    bVar42 = (uVar11 != 0) * (uVar11 < 0x100) * auVar52[4] - (0xff < uVar11);
                    sVar12 = auVar52._8_2_;
                    cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar52[8] - (0xff < sVar12);
                    sVar13 = auVar52._10_2_;
                    sVar33 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar52[10] -
                                      (0xff < sVar13),cVar4);
                    sVar15 = auVar52._12_2_;
                    cVar5 = (0 < sVar15) * (sVar15 < 0x100) * auVar52[0xc] - (0xff < sVar15);
                    sVar16 = auVar52._14_2_;
                    uVar2 = CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar52[0xe] -
                                     (0xff < sVar16),CONCAT12(cVar5,sVar33));
                    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar52[0] - (0xff < sVar9);
                    uVar34 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar52[2] - (0xff < sVar10)
                                      ,CONCAT14(cVar6,uVar2));
                    bVar44 = (uVar11 != 0) * (uVar11 < 0x100) * auVar52[4] - (0xff < uVar11);
                    auVar35[6] = bVar44;
                    auVar35._0_6_ = uVar34;
                    auVar35._7_5_ = 0;
                    auVar51._0_12_ = auVar35 << 0x20;
                    cVar7 = (0 < sVar12) * (sVar12 < 0x100) * auVar52[8] - (0xff < sVar12);
                    auVar51[0xc] = cVar7;
                    auVar51[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar52[10] - (0xff < sVar13);
                    cVar8 = (0 < sVar15) * (sVar15 < 0x100) * auVar52[0xc] - (0xff < sVar15);
                    auVar53[0xe] = cVar8;
                    auVar53._0_14_ = auVar51;
                    auVar53[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar52[0xe] - (0xff < sVar16);
                    uVar11 = (ushort)bVar42;
                    auVar54[1] = (bVar42 != 0) * (uVar11 < 0x100) * bVar42 - (0xff < uVar11);
                    auVar54[0] = (0 < sVar46) * (sVar46 < 0x100) * cVar3 - (0xff < sVar46);
                    auVar54[2] = (0 < sVar33) * (sVar33 < 0x100) * cVar4 - (0xff < sVar33);
                    sVar9 = (short)((uint)uVar2 >> 0x10);
                    auVar54[3] = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
                    sVar10 = (short)((uint6)uVar34 >> 0x20);
                    auVar54[4] = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
                    uVar14 = (ushort)bVar44;
                    auVar54[5] = (bVar44 != 0) * (uVar14 < 0x100) * bVar44 - (0xff < uVar14);
                    sVar12 = auVar51._12_2_;
                    auVar54[6] = (0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12);
                    sVar13 = auVar53._14_2_;
                    auVar54[7] = (0 < sVar13) * (sVar13 < 0x100) * cVar8 - (0xff < sVar13);
                    auVar54[8] = (0 < sVar46) * (sVar46 < 0x100) * cVar3 - (0xff < sVar46);
                    auVar54[9] = (bVar42 != 0) * (uVar11 < 0x100) * bVar42 - (0xff < uVar11);
                    auVar54[10] = (0 < sVar33) * (sVar33 < 0x100) * cVar4 - (0xff < sVar33);
                    auVar54[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
                    auVar54[0xc] = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
                    auVar54[0xd] = (bVar44 != 0) * (uVar14 < 0x100) * bVar44 - (0xff < uVar14);
                    auVar54[0xe] = (0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12);
                    auVar54[0xf] = (0 < sVar13) * (sVar13 < 0x100) * cVar8 - (0xff < sVar13);
                    auVar55._0_8_ =
                         CONCAT44(uVar50 >> uVar39,((byte)(auVar48[0] >> uVar39) & 3) << uVar45) &
                         0x3ffffffff;
                    auVar55 = auVar55 & _DAT_001ae030;
                    sVar9 = auVar55._0_2_;
                    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * auVar55[0] - (0xff < sVar9);
                    sVar10 = auVar55._2_2_;
                    sVar46 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar55[2] - (0xff < sVar10)
                                      ,cVar3);
                    uVar11 = auVar55._4_2_;
                    bVar42 = (uVar11 != 0) * (uVar11 < 0x100) * auVar55[4] - (0xff < uVar11);
                    sVar12 = auVar55._8_2_;
                    cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar55[8] - (0xff < sVar12);
                    sVar13 = auVar55._10_2_;
                    sVar33 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar55[10] -
                                      (0xff < sVar13),cVar4);
                    sVar15 = auVar55._12_2_;
                    cVar5 = (0 < sVar15) * (sVar15 < 0x100) * auVar55[0xc] - (0xff < sVar15);
                    sVar16 = auVar55._14_2_;
                    uVar2 = CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar55[0xe] -
                                     (0xff < sVar16),CONCAT12(cVar5,sVar33));
                    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * auVar55[0] - (0xff < sVar9);
                    uVar34 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar55[2] - (0xff < sVar10)
                                      ,CONCAT14(cVar6,uVar2));
                    bVar44 = (uVar11 != 0) * (uVar11 < 0x100) * auVar55[4] - (0xff < uVar11);
                    auVar36[6] = bVar44;
                    auVar36._0_6_ = uVar34;
                    auVar36._7_5_ = 0;
                    auVar47._0_12_ = auVar36 << 0x20;
                    cVar7 = (0 < sVar12) * (sVar12 < 0x100) * auVar55[8] - (0xff < sVar12);
                    auVar47[0xc] = cVar7;
                    auVar47[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar55[10] - (0xff < sVar13);
                    cVar8 = (0 < sVar15) * (sVar15 < 0x100) * auVar55[0xc] - (0xff < sVar15);
                    auVar49[0xe] = cVar8;
                    auVar49._0_14_ = auVar47;
                    auVar49[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar55[0xe] - (0xff < sVar16);
                    uVar11 = (ushort)bVar42;
                    auVar48[1] = (bVar42 != 0) * (uVar11 < 0x100) * bVar42 - (0xff < uVar11);
                    auVar48[0] = (0 < sVar46) * (sVar46 < 0x100) * cVar3 - (0xff < sVar46);
                    auVar48[2] = (0 < sVar33) * (sVar33 < 0x100) * cVar4 - (0xff < sVar33);
                    sVar9 = (short)((uint)uVar2 >> 0x10);
                    auVar48[3] = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
                    sVar10 = (short)((uint6)uVar34 >> 0x20);
                    auVar48[4] = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
                    uVar14 = (ushort)bVar44;
                    auVar48[5] = (bVar44 != 0) * (uVar14 < 0x100) * bVar44 - (0xff < uVar14);
                    sVar12 = auVar47._12_2_;
                    auVar48[6] = (0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12);
                    sVar13 = auVar49._14_2_;
                    auVar48[7] = (0 < sVar13) * (sVar13 < 0x100) * cVar8 - (0xff < sVar13);
                    auVar48[8] = (0 < sVar46) * (sVar46 < 0x100) * cVar3 - (0xff < sVar46);
                    auVar48[9] = (bVar42 != 0) * (uVar11 < 0x100) * bVar42 - (0xff < uVar11);
                    auVar48[10] = (0 < sVar33) * (sVar33 < 0x100) * cVar4 - (0xff < sVar33);
                    auVar48[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9);
                    auVar48[0xc] = (0 < sVar10) * (sVar10 < 0x100) * cVar6 - (0xff < sVar10);
                    auVar48[0xd] = (bVar44 != 0) * (uVar14 < 0x100) * bVar44 - (0xff < uVar14);
                    auVar48[0xe] = (0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12);
                    auVar48[0xf] = (0 < sVar13) * (sVar13 < 0x100) * cVar8 - (0xff < sVar13);
                    auVar48 = auVar48 | (auVar54 | in_XMM2) & auVar56;
                    uVar38 = uVar38 + 2;
                    uVar45 = uVar45 - 2;
                  } while (local_54 != uVar38);
                  uVar2 = auVar48._0_4_;
                  local_60.m_selectors[2] = (char)uVar2;
                  local_60.m_selectors[3] = (char)((uint)uVar2 >> 8);
                  local_60.m_selectors[4] = (char)((uint)uVar2 >> 0x10);
                  local_60.m_selectors[5] = (char)((uint)uVar2 >> 0x18);
                }
                *(dxt5_block *)
                 (local_48->m_pElements +
                 ((local_48->m_blocks_x * (int)local_40 + local_50) *
                  local_48->m_num_elements_per_block + (int)local_38)) = local_60;
                local_38 = local_38 + 1;
                uVar50 = local_48->m_num_elements_per_block;
                uVar39 = (ulong)uVar50;
                this = local_48;
                uVar45 = local_50;
              } while (local_38 < uVar39);
              uVar38 = local_48->m_blocks_y;
            }
            uVar43 = (int)local_40 + 1;
            local_40 = (ulong)uVar43;
            uVar17 = uVar50;
          } while (uVar43 < uVar38);
          bVar41 = true;
        }
      }
    }
  }
  return bVar41;
}

Assistant:

bool dxt_image::flip_x()
    {
        if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS)
        {
            // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
            return false;
        }

        if ((m_width & 3) && (m_width > 4))
        {
            return false;
        }

        if (m_width == 1)
        {
            return true;
        }

        const uint mid_x = m_blocks_x / 2;

        for (uint x = 0; x < mid_x; x++)
        {
            flip_col(x);
        }

        if (m_blocks_x & 1)
        {
            const uint w = math::minimum(m_width, 4U);
            for (uint y = 0; y < m_blocks_y; y++)
            {
                for (uint e = 0; e < get_elements_per_block(); e++)
                {
                    element tmp(get_element(mid_x, y, e));
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp)->flip_x(w, 4);
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp)->flip_x(w, 4);
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp)->flip_x(w, 4);
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                    get_element(mid_x, y, e) = tmp;
                }
            }
        }

        return true;
    }